

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

bid_t sb_alloc_block(filemgr *file)

{
  bool bVar1;
  uint64_t uVar2;
  long lVar3;
  superblock *psVar4;
  __pointer_type puVar5;
  avl_node *paVar6;
  long in_RDI;
  bool switched_2;
  bool switched_1;
  bool switched;
  bmp_idx_node query;
  bmp_idx_node *item;
  avl_node *a;
  superblock *sb;
  bid_t ret;
  uint64_t bmp_off;
  uint64_t bmp_idx;
  uint64_t node_off;
  uint64_t node_idx;
  uint64_t i;
  superblock *in_stack_ffffffffffffff78;
  uint5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  avl_node *in_stack_ffffffffffffff90;
  avl_tree *in_stack_ffffffffffffff98;
  avl_node **node;
  filemgr *file_00;
  ulong local_28;
  avl_node *local_20;
  ulong local_18;
  
  file_00 = *(filemgr **)(in_RDI + 0x198);
  (file_00->header).stat.ndeletes = (file_00->header).stat.ndeletes + 1;
  while( true ) {
    bVar1 = sb_bmp_exists(in_stack_ffffffffffffff78);
    if (!bVar1) {
      return 0xffffffffffffffff;
    }
    if ((file_00->header).op_stat.num_commits.super___atomic_base<unsigned_long>._M_i != 0) break;
    in_stack_ffffffffffffff87 = false;
    if ((file_00->header).op_stat.num_compacts.super___atomic_base<unsigned_long>._M_i != 0) {
      in_stack_ffffffffffffff87 = sb_switch_reserved_blocks(file_00);
    }
    if ((bool)in_stack_ffffffffffffff87 == false) {
      atomic_store_uint64_t
                ((atomic<unsigned_long> *)
                 (ulong)CONCAT16(in_stack_ffffffffffffff86,
                                 CONCAT15(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80)),
                 (uint64_t)in_stack_ffffffffffffff78,memory_order_relaxed);
      return 0xffffffffffffffff;
    }
  }
  uVar2 = atomic_get_uint64_t((atomic<unsigned_long> *)
                              CONCAT17(in_stack_ffffffffffffff87,
                                       CONCAT16(in_stack_ffffffffffffff86,
                                                CONCAT15(in_stack_ffffffffffffff85,
                                                         in_stack_ffffffffffffff80))),
                              (memory_order)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  (file_00->header).op_stat.num_commits.super___atomic_base<unsigned_long>._M_i =
       (file_00->header).op_stat.num_commits.super___atomic_base<unsigned_long>._M_i - 1;
  if ((file_00->header).op_stat.num_commits.super___atomic_base<unsigned_long>._M_i == 0) {
    bVar1 = false;
    if ((file_00->header).op_stat.num_compacts.super___atomic_base<unsigned_long>._M_i != 0) {
      bVar1 = sb_switch_reserved_blocks(file_00);
    }
    if (bVar1 != false) {
      return uVar2;
    }
    atomic_store_uint64_t
              ((atomic<unsigned_long> *)
               CONCAT17(in_stack_ffffffffffffff87,
                        (uint7)CONCAT15(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80)),
               (uint64_t)in_stack_ffffffffffffff78,memory_order_relaxed);
    return uVar2;
  }
  local_20 = (avl_node *)(uVar2 >> 8);
  local_28 = (uVar2 & 0xff) + 1;
  do {
    for (local_18 = local_28; local_18 < 0x100; local_18 = local_18 + 1) {
      lVar3 = (local_18 >> 3) + (long)local_20 * 0x20;
      in_stack_ffffffffffffff78 = (superblock *)(lVar3 * 8 + (local_18 & 7));
      psVar4 = (superblock *)
               atomic_get_uint64_t((atomic<unsigned_long> *)
                                   CONCAT17(in_stack_ffffffffffffff87,
                                            CONCAT16(in_stack_ffffffffffffff86,
                                                     CONCAT15(in_stack_ffffffffffffff85,
                                                              in_stack_ffffffffffffff80))),
                                   (memory_order)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      if (psVar4 <= in_stack_ffffffffffffff78) break;
      puVar5 = std::atomic::operator_cast_to_unsigned_char_((atomic<unsigned_char_*> *)0x16dbd5);
      if ((puVar5[lVar3] & bmp_basic_mask[local_18 & 7]) != 0) {
        atomic_store_uint64_t
                  ((atomic<unsigned_long> *)
                   CONCAT17(in_stack_ffffffffffffff87,
                            CONCAT16(in_stack_ffffffffffffff86,
                                     CONCAT15(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80)))
                   ,(uint64_t)in_stack_ffffffffffffff78,memory_order_relaxed);
        return uVar2;
      }
    }
    paVar6 = avl_search(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(avl_cmp_func *)local_20
                       );
    if (paVar6 != (avl_node *)0x0) {
      node = &paVar6[-1].right;
      avl_remove((avl_tree *)paVar6,(avl_node *)node);
      free(node);
    }
    paVar6 = avl_first((avl_tree *)&file_00->header);
    if (paVar6 == (avl_node *)0x0) {
      (file_00->header).op_stat.num_commits.super___atomic_base<unsigned_long>._M_i = 0;
      bVar1 = false;
      if ((file_00->header).op_stat.num_compacts.super___atomic_base<unsigned_long>._M_i != 0) {
        bVar1 = sb_switch_reserved_blocks(file_00);
      }
      if (bVar1 != false) {
        return uVar2;
      }
      atomic_store_uint64_t
                ((atomic<unsigned_long> *)
                 CONCAT17(in_stack_ffffffffffffff87,
                          CONCAT16(in_stack_ffffffffffffff86,(uint6)in_stack_ffffffffffffff80)),
                 (uint64_t)in_stack_ffffffffffffff78,memory_order_relaxed);
      return uVar2;
    }
    local_20 = paVar6[-1].right;
    local_28 = 0;
  } while( true );
}

Assistant:

bid_t sb_alloc_block(struct filemgr *file)
{
    uint64_t i, node_idx, node_off, bmp_idx, bmp_off;
    bid_t ret = BLK_NOT_FOUND;
    struct superblock *sb = file->sb;
    struct avl_node *a;
    struct bmp_idx_node *item, query;

    sb->num_alloc++;
sb_alloc_start_over:
    if (!sb_bmp_exists(sb)) {
        // no bitmap
        return BLK_NOT_FOUND;
    }

    if (sb->num_free_blocks == 0) {
        bool switched = false;
        if (sb->rsv_bmp) {
            switched = sb_switch_reserved_blocks(file);
        }
        if (switched) {
            goto sb_alloc_start_over;
        } else {
            atomic_store_uint64_t(&sb->cur_alloc_bid, BLK_NOT_FOUND);
            return BLK_NOT_FOUND;
        }
    }

    ret = atomic_get_uint64_t(&sb->cur_alloc_bid);
    sb->num_free_blocks--;

    if (sb->num_free_blocks == 0) {
        bool switched = false;
        if (sb->rsv_bmp) {
            switched = sb_switch_reserved_blocks(file);
        }
        if (!switched) {
            atomic_store_uint64_t(&sb->cur_alloc_bid, BLK_NOT_FOUND);
        }
        return ret;
    }

    // find allocable block in the same bmp idx node
    node_idx = ret >> 8;
    node_off = (ret & 0xff)+1;
    do {
        for (i=node_off; i<256; ++i) {
            bmp_idx = div8(i) + (node_idx * 32);
            bmp_off = mod8(i);

            if (bmp_idx*8 + bmp_off >= atomic_get_uint64_t(&sb->bmp_size)) {
                break;
            }

            if (sb->bmp[bmp_idx] & bmp_basic_mask[bmp_off]) {
                atomic_store_uint64_t(&sb->cur_alloc_bid, bmp_idx*8 + bmp_off);
                return ret;
            }
        }

        // current bmp_node does not include any free block .. remove
        query.id = node_idx;
        a = avl_search(&sb->bmp_idx, &query.avl, _bmp_idx_cmp);
        if (a) {
            item = _get_entry(a, struct bmp_idx_node, avl);
            avl_remove(&sb->bmp_idx, a);
            free(item);
        }

        // get next allocable bmp_node
        a = avl_first(&sb->bmp_idx);
        if (!a) {
            // no more free bmp_node
            sb->num_free_blocks = 0;
            bool switched = false;
            if (sb->rsv_bmp) {
                switched = sb_switch_reserved_blocks(file);
            }
            if (!switched) {
                atomic_store_uint64_t(&sb->cur_alloc_bid, BLK_NOT_FOUND);
            }
            break;
        }
        item = _get_entry(a, struct bmp_idx_node, avl);
        node_idx = item->id;
        node_off = 0;
    } while (true);

    return ret;
}